

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_if_icmple(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar1;
  Value VVar2;
  Value VVar3;
  undefined2 local_4a;
  int16_t branchOffset;
  u1 byte2;
  u1 byte1;
  u1 *code;
  Value value1;
  Value value2;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar2 = Frame::popTopOfOperandStack(this_01);
  VVar3 = Frame::popTopOfOperandStack(this_01);
  code._4_4_ = VVar3.type;
  if (code._4_4_ != INT) {
    __assert_fail("value1.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xcaa,"void ExecutionEngine::i_if_icmple()");
  }
  value1.data.longValue._4_4_ = VVar2.type;
  if (value1.data.longValue._4_4_ == 4) {
    value1.printType = VVar3.data._0_4_;
    value2.printType = VVar2.data._0_4_;
    if ((int)value2.printType < (int)value1.printType) {
      this_01->pc = this_01->pc + 3;
    }
    else {
      puVar1 = Frame::getCode(this_01,this_01->pc);
      local_4a = CONCAT11(puVar1[1],puVar1[2]);
      this_01->pc = (int)local_4a + this_01->pc;
    }
    return;
  }
  __assert_fail("value2.type == ValueType::INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0xcab,"void ExecutionEngine::i_if_icmple()");
}

Assistant:

void ExecutionEngine::i_if_icmple() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();
	
	Value value2 = topFrame->popTopOfOperandStack();
	Value value1 = topFrame->popTopOfOperandStack();
	assert(value1.type == ValueType::INT);
	assert(value2.type == ValueType::INT);
	
	if (value1.data.intValue <= value2.data.intValue) {
		u1 *code = topFrame->getCode(topFrame->pc);
		u1 byte1 = code[1];
		u1 byte2 = code[2];
		int16_t branchOffset = (byte1 << 8) | byte2;
		topFrame->pc += branchOffset;
    } else {
		topFrame->pc += 3;
    }
}